

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

ssize_t next_line(archive_read *a,char **b,ssize_t *avail,ssize_t *ravail,ssize_t *nl)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  ssize_t tested;
  size_t nbytes_req;
  ssize_t diff;
  long lStack_40;
  int quit;
  ssize_t len;
  ssize_t *nl_local;
  ssize_t *ravail_local;
  ssize_t *avail_local;
  char **b_local;
  archive_read *a_local;
  
  bVar2 = false;
  if (*avail == 0) {
    *nl = 0;
    lStack_40 = 0;
    lVar5 = lStack_40;
  }
  else {
    lVar5 = get_line_size(*b,*avail,nl);
  }
  while( true ) {
    lStack_40 = lVar5;
    bVar3 = false;
    if ((*nl == 0) && (bVar3 = false, lStack_40 == *avail)) {
      bVar3 = !bVar2;
    }
    if (!bVar3) break;
    lVar5 = *ravail;
    lVar1 = *avail;
    tested = *ravail + 0x3ffU & 0xfffffc00;
    if (0xfffff < lStack_40) {
      return -1;
    }
    if ((ulong)tested < *ravail + 0xa0U) {
      tested = tested << 1;
    }
    pcVar4 = (char *)__archive_read_ahead(a,tested,avail);
    *b = pcVar4;
    if (*b == (char *)0x0) {
      if (*avail <= *ravail) {
        return 0;
      }
      pcVar4 = (char *)__archive_read_ahead(a,*avail,avail);
      *b = pcVar4;
      bVar2 = true;
    }
    *ravail = *avail;
    *b = *b + (lVar5 - lVar1);
    *avail = *avail - (lVar5 - lVar1);
    lVar5 = get_line_size(*b + lStack_40,*avail - lStack_40,nl);
    if (-1 < lVar5) {
      lVar5 = lStack_40 + lVar5;
    }
  }
  return lStack_40;
}

Assistant:

static ssize_t
next_line(struct archive_read *a,
    const char **b, ssize_t *avail, ssize_t *ravail, ssize_t *nl)
{
	ssize_t len;
	int quit;
	
	quit = 0;
	if (*avail == 0) {
		*nl = 0;
		len = 0;
	} else
		len = get_line_size(*b, *avail, nl);
	/*
	 * Read bytes more while it does not reach the end of line.
	 */
	while (*nl == 0 && len == *avail && !quit) {
		ssize_t diff = *ravail - *avail;
		size_t nbytes_req = (*ravail+1023) & ~1023U;
		ssize_t tested;

		/*
		 * Place an arbitrary limit on the line length.
		 * mtree is almost free-form input and without line length limits,
		 * it can consume a lot of memory.
		 */
		if (len >= MAX_LINE_LEN)
			return (-1);

		/* Increase reading bytes if it is not enough to at least
		 * new two lines. */
		if (nbytes_req < (size_t)*ravail + 160)
			nbytes_req <<= 1;

		*b = __archive_read_ahead(a, nbytes_req, avail);
		if (*b == NULL) {
			if (*ravail >= *avail)
				return (0);
			/* Reading bytes reaches the end of file. */
			*b = __archive_read_ahead(a, *avail, avail);
			quit = 1;
		}
		*ravail = *avail;
		*b += diff;
		*avail -= diff;
		tested = len;/* Skip some bytes we already determinated. */
		len = get_line_size(*b + len, *avail - len, nl);
		if (len >= 0)
			len += tested;
	}
	return (len);
}